

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arccurve.cpp
# Opt level: O0

bool __thiscall ON_ArcCurve::SetDomain(ON_ArcCurve *this,double t0,double t1)

{
  bool rc;
  double t1_local;
  double t0_local;
  ON_ArcCurve *this_local;
  
  if (t0 < t1) {
    ON_Interval::Set(&this->m_t,t0,t1);
  }
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return t0 < t1;
}

Assistant:

bool ON_ArcCurve::SetDomain( double t0, double t1 )
{
  bool rc = false;
  if ( t0 < t1 )
  {
    m_t.Set(t0,t1);
    rc = true;
  }
	DestroyCurveTree();
  return rc;
}